

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metaf.hpp
# Opt level: O2

AppendResult __thiscall
metaf::WeatherGroup::append
          (WeatherGroup *this,string *group,ReportPart reportPart,ReportMetadata *reportMetadata)

{
  IncompleteText IVar1;
  ulong uVar2;
  bool bVar3;
  char *__rhs;
  optional<metaf::WeatherPhenomena> wp;
  
  IVar1 = this->incompleteText;
  if (IVar1 == TSLTNG_TEMPO) {
    __rhs = "UNAVBL";
  }
  else {
    if (IVar1 == TSLTNG) {
      bVar3 = std::operator!=(group,"TEMPO");
      if (bVar3) {
        return GROUP_INVALIDATED;
      }
      this->incompleteText = TSLTNG_TEMPO;
      return APPENDED;
    }
    if (IVar1 != WX) {
      if (RECENT < this->t) {
        return NOT_APPENDED;
      }
      parseWeatherWithoutEvent(&wp,group,reportPart);
      if (wp.super__Optional_base<metaf::WeatherPhenomena,_true,_true>._M_payload.
          super__Optional_payload_base<metaf::WeatherPhenomena>._M_engaged == true) {
        if (this->t == RECENT) {
          if ((wp.super__Optional_base<metaf::WeatherPhenomena,_true,_true>._M_payload.
               super__Optional_payload_base<metaf::WeatherPhenomena>._M_payload._M_value.data & 7)
              != 1) {
            return NOT_APPENDED;
          }
        }
        else if ((this->t == CURRENT) &&
                ((wp.super__Optional_base<metaf::WeatherPhenomena,_true,_true>._M_payload.
                  super__Optional_payload_base<metaf::WeatherPhenomena>._M_payload._M_value.data & 7
                 ) == 1)) {
          return NOT_APPENDED;
        }
        uVar2 = this->wsz;
        if (uVar2 < 0x14) {
          this->wsz = uVar2 + 1;
          *(undefined8 *)
           ((long)&this->w[uVar2].tm.super__Optional_base<metaf::MetafTime,_true,_true>._M_payload.
                   super__Optional_payload_base<metaf::MetafTime>._M_payload + 0xc) =
               wp.super__Optional_base<metaf::WeatherPhenomena,_true,_true>._M_payload.
               super__Optional_payload_base<metaf::WeatherPhenomena>._M_payload._16_8_;
          *(ulong *)(this->w + uVar2) =
               CONCAT44(wp.super__Optional_base<metaf::WeatherPhenomena,_true,_true>._M_payload.
                        super__Optional_payload_base<metaf::WeatherPhenomena>._M_payload._4_4_,
                        wp.super__Optional_base<metaf::WeatherPhenomena,_true,_true>._M_payload.
                        super__Optional_payload_base<metaf::WeatherPhenomena>._M_payload._M_value.
                        data);
          *(undefined8 *)
           ((long)&this->w[uVar2].tm.super__Optional_base<metaf::MetafTime,_true,_true>._M_payload.
                   super__Optional_payload_base<metaf::MetafTime>._M_payload + 4) =
               wp.super__Optional_base<metaf::WeatherPhenomena,_true,_true>._M_payload.
               super__Optional_payload_base<metaf::WeatherPhenomena>._M_payload._8_8_;
        }
        return (uint)(0x13 < uVar2);
      }
      return NOT_APPENDED;
    }
    __rhs = "MISG";
  }
  bVar3 = std::operator!=(group,__rhs);
  if (bVar3) {
    return GROUP_INVALIDATED;
  }
  this->incompleteText = NONE;
  return APPENDED;
}

Assistant:

AppendResult WeatherGroup::append(const std::string & group,
	ReportPart reportPart,
	const ReportMetadata & reportMetadata)
{
	(void)reportMetadata;
	switch (incompleteText) {
		case IncompleteText::NONE:
		break;

		case IncompleteText::WX:
		if (group != "MISG") return AppendResult::GROUP_INVALIDATED;
		incompleteText = IncompleteText::NONE; 
		return AppendResult::APPENDED;

		case IncompleteText::TSLTNG:
		if (group != "TEMPO") return AppendResult::GROUP_INVALIDATED;
		incompleteText = IncompleteText::TSLTNG_TEMPO; 
		return AppendResult::APPENDED;

		case IncompleteText::TSLTNG_TEMPO:
		if (group != "UNAVBL") return AppendResult::GROUP_INVALIDATED;
		incompleteText = IncompleteText::NONE;
		return AppendResult::APPENDED;
	}

	if (type() != Type::CURRENT && type() != Type::RECENT)
		return AppendResult::NOT_APPENDED;

	const auto wp = parseWeatherWithoutEvent(group, reportPart);
	if (wp.has_value()) {
		// Recent weather cannot be appended to current weather and vice versa
		if (type() == Type::CURRENT && 
			wp->qualifier() == WeatherPhenomena::Qualifier::RECENT) return AppendResult::NOT_APPENDED;
		if (type() == Type::RECENT && 
			wp->qualifier() != WeatherPhenomena::Qualifier::RECENT) return AppendResult::NOT_APPENDED;

		if (!addWeatherPhenomena(*wp)) return AppendResult::NOT_APPENDED;
		return AppendResult::APPENDED;
	}
	return AppendResult::NOT_APPENDED;
}